

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

cbtScalar __thiscall
cbtCollisionWorld::rayTestSingleInternal::BridgeTriangleRaycastCallback::reportHit
          (BridgeTriangleRaycastCallback *this,cbtVector3 *hitNormalLocal,cbtScalar hitFraction,
          int partId,int triangleIndex)

{
  undefined1 auVar1 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar4;
  LocalShapeInfo shapeInfo;
  cbtCollisionObject *local_38;
  LocalShapeInfo *local_30;
  undefined1 local_28 [16];
  cbtScalar local_18;
  
  auVar3 = in_register_00001204._4_56_;
  shapeInfo.m_shapePart = partId;
  shapeInfo.m_triangleIndex = triangleIndex;
  cVar4 = ::operator*(&(this->m_colObjWorldTransform).m_basis,hitNormalLocal);
  auVar2._0_8_ = cVar4.m_floats._0_8_;
  auVar2._8_56_ = auVar3;
  local_38 = this->m_collisionObject;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar4.m_floats._8_8_;
  local_28 = vmovlhps_avx(auVar2._0_16_,auVar1);
  local_30 = &shapeInfo;
  local_18 = hitFraction;
  (*this->m_resultCallback->_vptr_RayResultCallback[3])(this->m_resultCallback,&local_38,1);
  return hitFraction;
}

Assistant:

virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
				{
					cbtCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = partId;
					shapeInfo.m_triangleIndex = triangleIndex;

					cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

					cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
															   &shapeInfo,
															   hitNormalWorld,
															   hitFraction);

					bool normalInWorldSpace = true;
					return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
				}